

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O0

void upd7759_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  int iVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  int local_58;
  uint local_54;
  INT32 rem_clocks;
  int clocks_this_time;
  DEV_SMPL *buffer2;
  DEV_SMPL *buffer;
  UINT32 pos;
  UINT32 step;
  uint uStack_2c;
  INT16 sample;
  INT32 clocks_left;
  UINT32 i;
  upd7759_state *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  step = *(UINT32 *)((long)param + 0x24);
  if (*(char *)((long)param + 0x61) == '\0') {
    pos._2_2_ = *(short *)((long)param + 0x42);
  }
  else {
    pos._2_2_ = 0;
  }
  iVar1 = *(int *)((long)param + 0x10);
  buffer._4_4_ = *(uint *)((long)param + 0xc);
  pDVar2 = *outputs;
  pDVar3 = outputs[1];
  uStack_2c = 0;
  if (*(char *)((long)param + 0x20) != '\0') {
    for (; uStack_2c < samples; uStack_2c = uStack_2c + 1) {
      pDVar2[uStack_2c] = (int)pos._2_2_ << 7;
      pDVar3[uStack_2c] = (int)pos._2_2_ << 7;
      buffer._4_4_ = iVar1 + buffer._4_4_;
      if (*(char *)((long)param + 0x60) == '\0') {
        while (*(long *)((long)param + 0x48) != 0 && 0xfffff < buffer._4_4_) {
          local_54 = buffer._4_4_ >> 0x14;
          if ((int)step < (int)local_54) {
            local_54 = step;
          }
          buffer._4_4_ = buffer._4_4_ + local_54 * -0x100000;
          step = step - local_54;
          if (step == 0) {
            advance_state((upd7759_state *)param);
            if (*(char *)((long)param + 0x20) == '\0') break;
            step = *(UINT32 *)((long)param + 0x24);
            if (*(char *)((long)param + 0x61) == '\0') {
              pos._2_2_ = *(short *)((long)param + 0x42);
            }
            else {
              pos._2_2_ = 0;
            }
          }
        }
      }
      else {
        local_58 = 4;
        while (local_58 != 0 && (int)step <= local_58) {
          local_58 = local_58 - step;
          upd7759_slave_update(param);
          step = *(UINT32 *)((long)param + 0x24);
        }
        step = step - local_58;
      }
    }
  }
  if (uStack_2c < samples) {
    memset(pDVar2 + uStack_2c,0,(ulong)(samples - uStack_2c) << 2);
    memset(pDVar3 + uStack_2c,0,(ulong)(samples - uStack_2c) << 2);
  }
  *(UINT32 *)((long)param + 0x24) = step;
  *(uint *)((long)param + 0xc) = buffer._4_4_;
  return;
}

Assistant:

static void upd7759_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	upd7759_state *chip = (upd7759_state *)param;
	UINT32 i;
	INT32 clocks_left = chip->clocks_left;
	INT16 sample = chip->Muted ? 0 : chip->sample;
	UINT32 step = chip->step;
	UINT32 pos = chip->pos;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];

	/* loop until done */
	i = 0;
	if (chip->state != STATE_IDLE)
		for (; i < samples; i++)
		{
			/* store the current sample */
			buffer[i] = sample << 7;
			buffer2[i] = sample << 7;

			/* advance by the number of clocks/output sample */
			pos += step;

			/* handle clocks, but only in standalone mode */
			if (! chip->ChipMode)
			{
				while (chip->rom && pos >= FRAC_ONE)
				{
					int clocks_this_time = pos >> FRAC_BITS;
					if (clocks_this_time > clocks_left)
						clocks_this_time = clocks_left;

					/* clock once */
					pos -= clocks_this_time * FRAC_ONE;
					clocks_left -= clocks_this_time;

					/* if we're out of clocks, time to handle the next state */
					if (clocks_left == 0)
					{
						/* advance one state; if we hit idle, bail */
						advance_state(chip);
						if (chip->state == STATE_IDLE)
							break;

						/* reimport the variables that we cached */
						clocks_left = chip->clocks_left;
						sample = chip->Muted ? 0 : chip->sample;
					}
				}
			}
			else
			{
				// advance the state (4x because of Clock Divider /4)
				INT32 rem_clocks = 4;
				
				while(rem_clocks && clocks_left <= rem_clocks)
				{
					rem_clocks -= clocks_left;
					upd7759_slave_update(chip);
					clocks_left = chip->clocks_left;
				}
				clocks_left -= rem_clocks;
			}
		}

	/* if we got out early, just zap the rest of the buffer */
	if (i < samples)
	{
		samples -= i;
		memset(&buffer[i], 0, samples * sizeof(DEV_SMPL));
		memset(&buffer2[i], 0, samples * sizeof(DEV_SMPL));
	}

	/* flush the state back */
	chip->clocks_left = clocks_left;
	chip->pos = pos;
}